

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::all2all<std::pair<int,int>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,mxx *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *msgs,comm *comm)

{
  ulong uVar1;
  char *in_R8;
  int rank;
  uint local_2c;
  
  uVar1 = (ulong)(*(long *)(this + 8) - *(long *)this) >> 3;
  if ((int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
           (long)*(int *)&(msgs->
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage) != 0) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_2c);
    in_R8 = "all2all";
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_2c,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
           ,0x4b2,"all2all","(int)msgs.size() % comm.size() == 0");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  all2all<std::pair<int,int>>
            (__return_storage_ptr__,*(mxx **)this,
             (pair<int,_int> *)
             ((ulong)(*(long *)(this + 8) - (long)*(mxx **)this >> 3) /
             (ulong)(long)*(int *)&(msgs->
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_end_of_storage),(size_t)msgs
             ,(comm *)in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2all(const std::vector<T>& msgs, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT((int)msgs.size() % comm.size() == 0);
    size_t size = msgs.size() / comm.size();
    std::vector<T> result = all2all(&msgs[0], size, comm);
    return result;
}